

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O0

int sam_write1(htsFile *fp,bam_hdr_t *h,bam1_t *b)

{
  int iVar1;
  size_t sVar2;
  bam1_t *b_local;
  bam_hdr_t *h_local;
  htsFile *fp_local;
  
  switch((fp->format).format) {
  case binary_format:
    (fp->format).category = sequence_data;
    (fp->format).format = bam;
  case bam:
    fp_local._4_4_ = bam_write1((fp->fp).bgzf,b);
    break;
  case text_format:
    (fp->format).category = sequence_data;
    (fp->format).format = sam;
  case sam:
    iVar1 = sam_format1(h,b,&fp->line);
    if (iVar1 < 0) {
      fp_local._4_4_ = -1;
    }
    else {
      kputc(10,&fp->line);
      sVar2 = hwrite((fp->fp).hfile,(fp->line).s,(fp->line).l);
      if (sVar2 == (fp->line).l) {
        fp_local._4_4_ = (int)(fp->line).l;
      }
      else {
        fp_local._4_4_ = -1;
      }
    }
    break;
  default:
    abort();
  case cram:
    fp_local._4_4_ = cram_put_bam_seq((fp->fp).cram,b);
  }
  return fp_local._4_4_;
}

Assistant:

int sam_write1(htsFile *fp, const bam_hdr_t *h, const bam1_t *b)
{
    switch (fp->format.format) {
    case binary_format:
        fp->format.category = sequence_data;
        fp->format.format = bam;
        /* fall-through */
    case bam:
        return bam_write1(fp->fp.bgzf, b);

    case cram:
        return cram_put_bam_seq(fp->fp.cram, (bam1_t *)b);

    case text_format:
        fp->format.category = sequence_data;
        fp->format.format = sam;
        /* fall-through */
    case sam:
        if (sam_format1(h, b, &fp->line) < 0) return -1;
        kputc('\n', &fp->line);
        if ( hwrite(fp->fp.hfile, fp->line.s, fp->line.l) != fp->line.l ) return -1;
        return fp->line.l;

    default:
        abort();
    }
}